

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Game.cpp
# Opt level: O1

void __thiscall Kuhn::Game::reset(Game *this,bool skipChanceAction)

{
  int iVar1;
  int i;
  long lVar2;
  result_type_conflict1 rVar3;
  uint8_t (*pauVar4) [10];
  int i_1;
  int iVar5;
  int iVar6;
  undefined3 in_register_00000031;
  ulong uVar7;
  
  if (CONCAT31(in_register_00000031,skipChanceAction) == 0) {
    this->mCurrentPlayer = 3;
  }
  else {
    lVar2 = 0;
    do {
      (this->mCards)._M_elems[lVar2] = (int)lVar2;
      lVar2 = lVar2 + 1;
    } while (lVar2 != 3);
    uVar7 = 4;
    iVar6 = 3;
    do {
      rVar3 = std::
              mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
              ::operator()(this->mEngine);
      iVar1 = (this->mCards)._M_elems[uVar7 - 2];
      iVar5 = (int)((long)((ulong)(uint)((int)rVar3 >> 0x1f) << 0x20 | rVar3 & 0xffffffff) %
                   (long)iVar6);
      (this->mCards)._M_elems[uVar7 - 2] = (this->mCards)._M_elems[iVar5];
      (this->mCards)._M_elems[iVar5] = iVar1;
      uVar7 = uVar7 - 1;
      iVar6 = iVar6 + -1;
    } while (2 < uVar7);
    pauVar4 = this->mInfoSets;
    lVar2 = 0;
    do {
      (*pauVar4)[0] = (uint8_t)(this->mCards)._M_elems[lVar2];
      lVar2 = lVar2 + 1;
      pauVar4 = pauVar4 + 1;
    } while (lVar2 == 1);
    this->mTurnNum = 0;
    this->mCurrentPlayer = 0;
    this->mFirstBetTurn = -1;
    this->mBetPlayerNum = 0;
    this->mDone = false;
  }
  return;
}

Assistant:

void Game::reset(bool skipChanceAction) {
    if (!skipChanceAction) {
        mCurrentPlayer = PlayerNum + 1;
        return;
    }

    for (int i = 0; i < CardNum; ++i) {
        mCards[i] = i;
    }
    // shuffle cards
    for (int c1 = int(mCards.size()) - 1; c1 > 0; --c1) {
        const int c2 = int(mEngine()) % (c1 + 1);
        const int tmp = mCards[c1];
        mCards[c1] = mCards[c2];
        mCards[c2] = tmp;
    }
    for (int i = 0; i < PlayerNum; ++i) {
        mInfoSets[i][0] = mCards[i];
    }
    mTurnNum = 0;
    mCurrentPlayer = 0;
    mFirstBetTurn = -1;
    mBetPlayerNum = 0;
    mDone = false;
}